

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

int secp256k1_gej_eq_var(secp256k1_gej *a,secp256k1_gej *b)

{
  int iVar1;
  secp256k1_gej *in_RSI;
  secp256k1_gej *in_RDI;
  secp256k1_gej tmp;
  secp256k1_fe *in_stack_00000118;
  secp256k1_gej *in_stack_00000120;
  secp256k1_gej *in_stack_00000128;
  secp256k1_gej *in_stack_00000130;
  secp256k1_gej *in_stack_ffffffffffffff68;
  secp256k1_gej *in_stack_ffffffffffffff70;
  
  secp256k1_gej_verify(in_RSI);
  secp256k1_gej_verify(in_RDI);
  secp256k1_gej_neg(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  secp256k1_gej_add_var(in_stack_00000130,in_stack_00000128,in_stack_00000120,in_stack_00000118);
  iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x12df76);
  return iVar1;
}

Assistant:

static int secp256k1_gej_eq_var(const secp256k1_gej *a, const secp256k1_gej *b) {
    secp256k1_gej tmp;
    secp256k1_gej_verify(b);
    secp256k1_gej_verify(a);
    secp256k1_gej_neg(&tmp, a);
    secp256k1_gej_add_var(&tmp, &tmp, b, NULL);
    return secp256k1_gej_is_infinity(&tmp);
}